

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

bool nite::isNumber(string *number)

{
  int iVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *Input;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  string local_80;
  string local_60;
  string *local_40;
  uint local_34;
  
  local_40 = number;
  if ((isNumber(std::__cxx11::string)::numbers_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&isNumber(std::__cxx11::string)::numbers_abi_cxx11_), iVar1 != 0))
  {
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[0]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)isNumber(std::__cxx11::string)::numbers_abi_cxx11_,"0","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[1]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[1].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 1),"1","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[2]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[2].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 2),"2","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[3]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[3].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 3),"3","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[4]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[4].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 4),"4","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[5]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[5].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 5),"5","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[6]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[6].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 6),"6","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[7]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[7].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 7),"7","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[8]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[8].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 8),"8","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[9]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[9].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 9),"9","");
    isNumber(std::__cxx11::string)::numbers_abi_cxx11_[10]._M_dataplus._M_p =
         (pointer)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[10].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 10),".","");
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&isNumber(std::__cxx11::string)::numbers_abi_cxx11_);
    number = local_40;
  }
  strAt(&local_60,number,0);
  iVar1 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar1 == 0) {
    bVar5 = true;
  }
  else {
    strAt(&local_80,number,0);
    iVar1 = std::__cxx11::string::compare((char *)&local_80);
    bVar5 = iVar1 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  paVar2 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
    paVar2 = extraout_RAX;
  }
  Input = local_40;
  if (bVar5) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::__cxx11::string::erase((ulong)local_40,0);
  }
  if (Input->_M_string_length == 0) {
    local_34 = 0;
  }
  else {
    bVar5 = Input->_M_string_length == 0;
    local_34 = (uint)CONCAT71((int7)((ulong)paVar2 >> 8),bVar5);
    if (!bVar5) {
      uVar4 = 0;
      do {
        lVar3 = 8;
        bVar5 = false;
        do {
          strAt(&local_60,Input,(uint)uVar4);
          if (local_60._M_string_length ==
              *(size_t *)
               ((long)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[0]._M_dataplus._M_p +
               lVar3)) {
            if (local_60._M_string_length == 0) {
              bVar6 = true;
            }
            else {
              iVar1 = bcmp(local_60._M_dataplus._M_p,*(void **)(DKGray + lVar3 + 8),
                           local_60._M_string_length);
              bVar6 = iVar1 == 0;
            }
          }
          else {
            bVar6 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          if (bVar6) {
            bVar5 = true;
          }
          lVar3 = lVar3 + 0x20;
          Input = local_40;
        } while (lVar3 != 0x168);
        if (!bVar5) break;
        uVar4 = (ulong)((uint)uVar4 + 1);
        local_34 = (uint)(local_40->_M_string_length <= uVar4);
      } while (uVar4 < local_40->_M_string_length);
    }
  }
  return (bool)((byte)local_34 & 1);
}

Assistant:

bool nite::isNumber(String number){
	static const String numbers[]={
		"0","1","2","3","4","5",
		"6","7","8","9","."
	};
	static const unsigned size = sizeof(numbers)/sizeof(String);

	/* remove signs */
	if (nite::strAt(number,0)=="+" or nite::strAt(number,0)=="-")
		number.erase(0,1);

	if (number.length()==0)
		return 0;
	bool n=0;
	for (unsigned i=0; i<number.length(); i++){
		n=0;
		for (unsigned e=0; e<size; e++){
			if (nite::strAt(number,i)==numbers[e])
				n=1;
		}
		if (n==0)
			return 0;
	}
    return 1;

}